

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O1

void jpc_mqdec_setctxs(jpc_mqdec_t *mqdec,int numctxs,jpc_mqctx_t *ctxs)

{
  jpc_mqstate_t **ppjVar1;
  int iVar2;
  int_fast16_t *piVar3;
  int iVar4;
  
  ppjVar1 = mqdec->ctxs;
  iVar2 = mqdec->maxctxs;
  iVar4 = numctxs;
  if (iVar2 < numctxs) {
    iVar4 = iVar2;
  }
  if (0 < iVar4) {
    iVar4 = iVar4 + 1;
    piVar3 = &ctxs->ind;
    do {
      *ppjVar1 = (jpc_mqstate_t *)
                 ((long)&jpc_mqstates[0].qeval +
                 ((ulong)((jpc_mqctx_t *)(piVar3 + -1))->mps << 5 | *piVar3 << 6));
      ppjVar1 = ppjVar1 + 1;
      iVar4 = iVar4 + -1;
      piVar3 = piVar3 + 2;
    } while (1 < iVar4);
  }
  if (iVar2 - numctxs != 0 && numctxs <= iVar2) {
    iVar2 = (iVar2 - numctxs) + 1;
    do {
      *ppjVar1 = jpc_mqstates;
      ppjVar1 = ppjVar1 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void jpc_mqdec_setctxs(const jpc_mqdec_t *mqdec, int numctxs, const jpc_mqctx_t *ctxs)
{
	const jpc_mqstate_t **ctx;
	int n;

	ctx = mqdec->ctxs;
	n = JAS_MIN(mqdec->maxctxs, numctxs);
	while (--n >= 0) {
		*ctx = &jpc_mqstates[2 * ctxs->ind + ctxs->mps];
		++ctx;
		++ctxs;
	}
	n = mqdec->maxctxs - numctxs;
	while (--n >= 0) {
		*ctx = &jpc_mqstates[0];
		++ctx;
	}
}